

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Partial.cpp
# Opt level: O2

void __thiscall MT32Emu::Partial::~Partial(Partial *this)

{
  if (this->la32Pair != (LA32PartialPair *)0x0) {
    (*this->la32Pair->_vptr_LA32PartialPair[1])();
  }
  operator_delete(this->tva);
  operator_delete(this->tvp);
  operator_delete(this->tvf);
  return;
}

Assistant:

Partial::~Partial() {
	delete la32Pair;
	delete tva;
	delete tvp;
	delete tvf;
}